

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::Subprocess::Start
          (Subprocess *this,string *program,SearchMode search_mode)

{
  int iVar1;
  __pid_t _Var2;
  LogMessage *pLVar3;
  char *pcVar4;
  int *piVar5;
  size_t __n;
  int stdout_pipe [2];
  int stdin_pipe [2];
  char *argv [2];
  LogFinisher local_79;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  char *local_68;
  undefined8 local_60;
  LogMessage local_58;
  
  iVar1 = pipe(&local_70);
  if (iVar1 == -1) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/compiler/subprocess.cc"
               ,0x12a);
    pLVar3 = internal::LogMessage::operator<<(&local_58,"CHECK failed: pipe(stdin_pipe) != -1: ");
    internal::LogFinisher::operator=((LogFinisher *)&local_68,pLVar3);
    internal::LogMessage::~LogMessage(&local_58);
  }
  iVar1 = pipe(&local_78);
  if (iVar1 == -1) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/compiler/subprocess.cc"
               ,299);
    pLVar3 = internal::LogMessage::operator<<(&local_58,"CHECK failed: pipe(stdout_pipe) != -1: ");
    internal::LogFinisher::operator=((LogFinisher *)&local_68,pLVar3);
    internal::LogMessage::~LogMessage(&local_58);
  }
  pcVar4 = strdup((program->_M_dataplus)._M_p);
  local_60 = 0;
  local_68 = pcVar4;
  _Var2 = fork();
  this->child_pid_ = _Var2;
  if (_Var2 == -1) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/compiler/subprocess.cc"
               ,0x131);
    pLVar3 = internal::LogMessage::operator<<(&local_58,"fork: ");
    piVar5 = __errno_location();
    pcVar4 = strerror(*piVar5);
    pLVar3 = internal::LogMessage::operator<<(pLVar3,pcVar4);
    internal::LogFinisher::operator=(&local_79,pLVar3);
    internal::LogMessage::~LogMessage(&local_58);
  }
  else {
    if (_Var2 == 0) {
      dup2(local_70,0);
      dup2(local_74,1);
      close(local_70);
      close(local_6c);
      close(local_78);
      close(local_74);
      if (search_mode == EXACT_NAME) {
        execv(pcVar4,&local_68);
      }
      else if (search_mode == SEARCH_PATH) {
        execvp(pcVar4,&local_68);
      }
      pcVar4 = local_68;
      __n = strlen(local_68);
      write(2,pcVar4,__n);
      write(2,": program not found or is not executable\n",0x29);
      _exit(1);
    }
    free(pcVar4);
    close(local_70);
    close(local_74);
    this->child_stdin_ = local_6c;
    this->child_stdout_ = local_78;
  }
  return;
}

Assistant:

void Subprocess::Start(const string& program, SearchMode search_mode) {
  // Note that we assume that there are no other threads, thus we don't have to
  // do crazy stuff like using socket pairs or avoiding libc locks.

  // [0] is read end, [1] is write end.
  int stdin_pipe[2];
  int stdout_pipe[2];

  GOOGLE_CHECK(pipe(stdin_pipe) != -1);
  GOOGLE_CHECK(pipe(stdout_pipe) != -1);

  char* argv[2] = { strdup(program.c_str()), NULL };

  child_pid_ = fork();
  if (child_pid_ == -1) {
    GOOGLE_LOG(FATAL) << "fork: " << strerror(errno);
  } else if (child_pid_ == 0) {
    // We are the child.
    dup2(stdin_pipe[0], STDIN_FILENO);
    dup2(stdout_pipe[1], STDOUT_FILENO);

    close(stdin_pipe[0]);
    close(stdin_pipe[1]);
    close(stdout_pipe[0]);
    close(stdout_pipe[1]);

    switch (search_mode) {
      case SEARCH_PATH:
        execvp(argv[0], argv);
        break;
      case EXACT_NAME:
        execv(argv[0], argv);
        break;
    }

    // Write directly to STDERR_FILENO to avoid stdio code paths that may do
    // stuff that is unsafe here.
    int ignored;
    ignored = write(STDERR_FILENO, argv[0], strlen(argv[0]));
    const char* message = ": program not found or is not executable\n";
    ignored = write(STDERR_FILENO, message, strlen(message));
    (void) ignored;

    // Must use _exit() rather than exit() to avoid flushing output buffers
    // that will also be flushed by the parent.
    _exit(1);
  } else {
    free(argv[0]);

    close(stdin_pipe[0]);
    close(stdout_pipe[1]);

    child_stdin_ = stdin_pipe[1];
    child_stdout_ = stdout_pipe[0];
  }
}